

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.h
# Opt level: O2

ClassData * __thiscall
edition_unittest::TestFieldOrderings_NestedMessage::GetClassData
          (TestFieldOrderings_NestedMessage *this)

{
  void *prefetch_ptr;
  
  return (ClassData *)TestFieldOrderings_NestedMessage_class_data_;
}

Assistant:

PROTOBUF_ALWAYS_INLINE void PrefetchLine(const void* ptr, size_t line) {
  static_assert(kOpts.from.unit == PrefetchOpts::kBytes);
  const ptrdiff_t offset = kOpts.from.num + (line * ABSL_CACHELINE_SIZE);
  // Pointer + offset overflows don't matter for prefetching, because the
  // prefetch instruction is just a no-op for invalid addresses (although
  // potentially incurring the cost of a TLB page-walk if there's no valid
  // mapping for the page - but that should be rare in practice). Still, to
  // formally avoid UB, we perform the arithmetic in uintptr_t space.
  const void* prefetch_ptr =
      reinterpret_cast<const void*>(reinterpret_cast<uintptr_t>(ptr) + offset);
  __builtin_prefetch(prefetch_ptr, kOpts.mem_op, kOpts.locality);
}